

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution-test.c++
# Opt level: O2

bool capnp::compiler::anon_unknown_0::checkChange
               (Reader file1,Reader file2,ChangeKind changeKind,uint sharedOrdinalCount)

{
  Reader file;
  Reader file_00;
  ExceptionCallback *pEVar1;
  bool bVar2;
  Fault f;
  Maybe<kj::Own<capnp::MallocMessageBuilder>_> exampleBuilder;
  SchemaLoader loader;
  Maybe<kj::Exception> exception;
  NullableValue<kj::Exception> local_180;
  
  exampleBuilder.ptr.disposer = (Disposer *)0x0;
  exampleBuilder.ptr.ptr = (MallocMessageBuilder *)0x0;
  if (changeKind != INCOMPATIBLE) {
    kj::heap<capnp::MallocMessageBuilder>();
    exception.ptr._0_8_ = loader.impl.mutex._0_8_;
    exception.ptr.field_1.value.ownFile.content.ptr = (char *)loader.impl.mutex.waitersHead.ptr;
    loader.impl.mutex.waitersHead.ptr = (Waiter *)0x0;
    kj::Own<capnp::MallocMessageBuilder>::operator=
              (&exampleBuilder.ptr,(Own<capnp::MallocMessageBuilder> *)&exception);
    kj::Own<capnp::MallocMessageBuilder>::dispose((Own<capnp::MallocMessageBuilder> *)&exception);
    kj::Own<capnp::MallocMessageBuilder>::dispose((Own<capnp::MallocMessageBuilder> *)&loader);
  }
  SchemaLoader::SchemaLoader(&loader);
  file._reader.capTable = file1._reader.capTable;
  file._reader.segment = file1._reader.segment;
  file._reader.data = file1._reader.data;
  file._reader.pointers = file1._reader.pointers;
  file._reader.dataSize = file1._reader.dataSize;
  file._reader.pointerCount = file1._reader.pointerCount;
  file._reader._38_2_ = file1._reader._38_2_;
  file._reader.nestingLimit = file1._reader.nestingLimit;
  file._reader._44_4_ = file1._reader._44_4_;
  loadFile((Maybe<kj::Exception> *)&local_180,file,&loader,true,&exampleBuilder,sharedOrdinalCount);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_180);
  file_00._reader.capTable = file2._reader.capTable;
  file_00._reader.segment = file2._reader.segment;
  file_00._reader.data = file2._reader.data;
  file_00._reader.pointers = file2._reader.pointers;
  file_00._reader.dataSize = file2._reader.dataSize;
  file_00._reader.pointerCount = file2._reader.pointerCount;
  file_00._reader._38_2_ = file2._reader._38_2_;
  file_00._reader.nestingLimit = file2._reader.nestingLimit;
  file_00._reader._44_4_ = file2._reader._44_4_;
  loadFile(&exception,file_00,&loader,false,&exampleBuilder,sharedOrdinalCount);
  bVar2 = true;
  if (changeKind == COMPATIBLE) {
    if (exception.ptr.isSet != true) goto LAB_0016b352;
    pEVar1 = kj::getExceptionCallback();
    (*pEVar1->_vptr_ExceptionCallback[3])(pEVar1,&exception.ptr.field_1);
  }
  else {
    if (changeKind != INCOMPATIBLE) {
      if (changeKind != SUBTLY_COMPATIBLE) {
        kj::_::Debug::Fault::Fault
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                   ,0x2ee,FAILED,"changeKind == SUBTLY_COMPATIBLE","");
        kj::_::Debug::Fault::fatal(&f);
      }
      goto LAB_0016b352;
    }
    if (exception.ptr.isSet == false) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,capnp::compiler::ParsedFile::Reader&,capnp::compiler::ParsedFile::Reader&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/evolution-test.c++"
                 ,0x2eb,FAILED,"exception != nullptr","file1, file2",&file1,&file2);
      kj::_::Debug::Fault::fatal(&f);
    }
  }
  bVar2 = false;
LAB_0016b352:
  kj::_::NullableValue<kj::Exception>::~NullableValue(&exception.ptr);
  SchemaLoader::~SchemaLoader(&loader);
  kj::Own<capnp::MallocMessageBuilder>::dispose(&exampleBuilder.ptr);
  return bVar2;
}

Assistant:

bool checkChange(ParsedFile::Reader file1, ParsedFile::Reader file2, ChangeKind changeKind,
                 uint sharedOrdinalCount) {
  // Try loading file1 followed by file2 into the same SchemaLoader, expecting it to behave
  // according to changeKind.  Returns true if the files are both expected to be compatible and
  // actually are -- the main loop uses this to decide which version to keep

  kj::Maybe<kj::Own<MallocMessageBuilder>> exampleBuilder;

  if (changeKind != INCOMPATIBLE) {
    // For COMPATIBLE and SUBTLY_COMPATIBLE changes, build an example message with one schema
    // and check it with the other.
    exampleBuilder = kj::heap<MallocMessageBuilder>();
  }

  SchemaLoader loader;
  loadFile(file1, loader, true, exampleBuilder, sharedOrdinalCount);
  auto exception = loadFile(file2, loader, false, exampleBuilder, sharedOrdinalCount);

  if (changeKind == COMPATIBLE) {
    KJ_IF_MAYBE(e, exception) {
      kj::getExceptionCallback().onFatalException(kj::mv(*e));
      return false;
    } else {
      return true;
    }
  } else if (changeKind == INCOMPATIBLE) {
    KJ_ASSERT(exception != nullptr, file1, file2);
    return false;
  } else {
    KJ_ASSERT(changeKind == SUBTLY_COMPATIBLE);

    // SchemaLoader is allowed to throw an exception in this case, but we ignore it.
    return true;
  }
}